

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_transform_feedback_varying
               (NegativeTestContext *ctx)

{
  RenderContext *pRVar1;
  GLuint program_00;
  allocator<char> local_2f1;
  int maxTransformFeedbackVaryings;
  GLsizei length;
  GLuint tfID;
  GLsizei size;
  string local_2e0;
  GLenum type;
  char *tfVarying;
  char name [32];
  ShaderProgram programInvalid;
  ShaderProgram program;
  
  tfID = 0;
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)name,"#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&tfVarying);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "#version 300 es\nlayout(location = 0) out mediump vec4 fragColor;void main (void)\n{\n\tfragColor = vec4(0.0);\n}\n"
             ,(allocator<char> *)&maxTransformFeedbackVaryings);
  glu::makeVtxFragSources((ProgramSources *)&programInvalid,(string *)name,&local_2e0);
  glu::ShaderProgram::ShaderProgram(&program,pRVar1,(ProgramSources *)&programInvalid);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&programInvalid);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::__cxx11::string::~string((string *)name);
  pRVar1 = ctx->m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "#version 300 es\nvoid main (void)\n{\n\tgl_Position = vec4(0.0);\n}\n",
             (allocator<char> *)&maxTransformFeedbackVaryings);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tfVarying,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&length);
  glu::makeVtxFragSources((ProgramSources *)name,&local_2e0,(string *)&tfVarying);
  glu::ShaderProgram::ShaderProgram(&programInvalid,pRVar1,(ProgramSources *)name);
  glu::ProgramSources::~ProgramSources((ProgramSources *)name);
  std::__cxx11::string::~string((string *)&tfVarying);
  std::__cxx11::string::~string((string *)&local_2e0);
  tfVarying = "gl_Position";
  maxTransformFeedbackVaryings = 0;
  program_00 = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
  glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program_00);
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  glu::CallLogWrapper::glTransformFeedbackVaryings
            (&ctx->super_CallLogWrapper,program.m_program.m_program,1,&tfVarying,0x8c8c);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program.m_program.m_program);
  NegativeTestContext::expectError(ctx,0);
  glu::CallLogWrapper::glBindTransformFeedback(&ctx->super_CallLogWrapper,0x8e22,tfID);
  NegativeTestContext::expectError(ctx,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "GL_INVALID_VALUE is generated if program is not the name of a program object.",
             &local_2f1);
  NegativeTestContext::beginSection(ctx,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,program_00,0,0x20,&length,&size,&type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "GL_INVALID_VALUE is generated if index is greater or equal to the value of GL_TRANSFORM_FEEDBACK_VARYINGS."
             ,&local_2f1);
  NegativeTestContext::beginSection(ctx,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  glu::CallLogWrapper::glGetProgramiv
            (&ctx->super_CallLogWrapper,program.m_program.m_program,0x8c83,
             &maxTransformFeedbackVaryings);
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,program.m_program.m_program,maxTransformFeedbackVaryings,
             0x20,&length,&size,&type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e0,
             "GL_INVALID_OPERATION or GL_INVALID_VALUE is generated program has not been linked.",
             &local_2f1);
  NegativeTestContext::beginSection(ctx,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  glu::CallLogWrapper::glGetTransformFeedbackVarying
            (&ctx->super_CallLogWrapper,programInvalid.m_program.m_program,0,0x20,&length,&size,
             &type,(GLchar *)name);
  NegativeTestContext::expectError(ctx,0x502,0x501);
  NegativeTestContext::endSection(ctx);
  glu::CallLogWrapper::glDeleteTransformFeedbacks(&ctx->super_CallLogWrapper,1,&tfID);
  NegativeTestContext::expectError(ctx,0);
  glu::ShaderProgram::~ShaderProgram(&programInvalid);
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void get_transform_feedback_varying (NegativeTestContext& ctx)
{
	GLuint					tfID = 0;
	glu::ShaderProgram		program			(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));
	glu::ShaderProgram		programInvalid	(ctx.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, ""));
	const char* tfVarying	= "gl_Position";
	int						maxTransformFeedbackVaryings = 0;

	GLsizei					length;
	GLsizei					size;
	GLenum					type;
	char					name[32];

	const GLuint notAProgram = ctx.glCreateProgram();
	ctx.glDeleteProgram(notAProgram);

	ctx.glGenTransformFeedbacks				(1, &tfID);

	ctx.glTransformFeedbackVaryings			(program.getProgram(), 1, &tfVarying, GL_INTERLEAVED_ATTRIBS);
	ctx.expectError						(GL_NO_ERROR);
	ctx.glLinkProgram						(program.getProgram());
	ctx.expectError						(GL_NO_ERROR);

	ctx.glBindTransformFeedback				(GL_TRANSFORM_FEEDBACK, tfID);
	ctx.expectError						(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if program is not the name of a program object.");
	ctx.glGetTransformFeedbackVarying		(notAProgram, 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if index is greater or equal to the value of GL_TRANSFORM_FEEDBACK_VARYINGS.");
	ctx.glGetProgramiv						(program.getProgram(), GL_TRANSFORM_FEEDBACK_VARYINGS, &maxTransformFeedbackVaryings);
	ctx.glGetTransformFeedbackVarying		(program.getProgram(), maxTransformFeedbackVaryings, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_OPERATION or GL_INVALID_VALUE is generated program has not been linked.");
	ctx.glGetTransformFeedbackVarying		(programInvalid.getProgram(), 0, 32, &length, &size, &type, &name[0]);
	ctx.expectError						(GL_INVALID_OPERATION, GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTransformFeedbacks			(1, &tfID);
	ctx.expectError						(GL_NO_ERROR);
}